

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_setfreevariable(HSQUIRRELVM v,SQInteger idx,SQUnsignedInteger nval)

{
  SQObjectType type;
  SQObjectPtr *pSVar1;
  SQObjectPtr *obj;
  
  pSVar1 = stack_get(v,idx);
  type = (pSVar1->super_SQObject)._type;
  if (type == OT_NATIVECLOSURE) {
    if (nval < ((pSVar1->super_SQObject)._unVal.pClosure)->_defaultparams) {
      obj = SQVM::GetUp(v,-1);
      pSVar1 = ((pSVar1->super_SQObject)._unVal.pClosure)->_outervalues + nval;
      goto LAB_0011574d;
    }
  }
  else {
    if (type != OT_CLOSURE) {
      sq_aux_invalidtype(v,type);
      return -1;
    }
    if (nval < (ulong)((pSVar1->super_SQObject)._unVal.pClosure)->_function->_noutervalues) {
      obj = SQVM::GetUp(v,-1);
      pSVar1 = ((((pSVar1->super_SQObject)._unVal.pClosure)->_outervalues[nval].super_SQObject.
                 _unVal.pArray)->_values)._vals;
LAB_0011574d:
      SQObjectPtr::operator=(pSVar1,obj);
      SQVM::Pop(v);
      return 0;
    }
  }
  sq_throwerror(v,"invalid free var index");
  return -1;
}

Assistant:

SQRESULT sq_setfreevariable(HSQUIRRELVM v,SQInteger idx,SQUnsignedInteger nval)
{
    SQObjectPtr &self=stack_get(v,idx);
    switch(type(self))
    {
    case OT_CLOSURE:{
        SQFunctionProto *fp = _closure(self)->_function;
        if(((SQUnsignedInteger)fp->_noutervalues) > nval){
            *(_outer(_closure(self)->_outervalues[nval])->_valptr) = stack_get(v,-1);
        }
        else return sq_throwerror(v,_SC("invalid free var index"));
                    }
        break;
    case OT_NATIVECLOSURE:
        if(_nativeclosure(self)->_noutervalues > nval){
            _nativeclosure(self)->_outervalues[nval] = stack_get(v,-1);
        }
        else return sq_throwerror(v,_SC("invalid free var index"));
        break;
    default:
        return sq_aux_invalidtype(v,type(self));
    }
    v->Pop();
    return SQ_OK;
}